

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O3

Am_Drawonable * Get_a_drawonable(Am_Object *obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Drawonable *pAVar3;
  Am_Object window;
  Am_Object owner;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  local_20.data = (Am_Object_Data *)0x0;
  local_18.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Object::Valid(obj);
  if (bVar1) {
    pAVar2 = Am_Object::Get(obj,0x68,4);
    Am_Object::operator=(&local_20,pAVar2);
    bVar1 = Am_Object::Valid(&local_20);
    if (bVar1) {
      Am_Object::Get_Object(&local_10,(Am_Slot_Key)obj,10);
      Am_Object::operator=(&local_18,&local_10);
      Am_Object::~Am_Object(&local_10);
      bVar1 = Am_Object::Valid(&local_18);
      if (bVar1) {
        pAVar2 = Am_Object::Get(&local_20,0x7d2,4);
        pAVar3 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(pAVar2);
        if (pAVar3 != (Am_Drawonable *)0x0) goto LAB_001d6e5b;
      }
    }
  }
  pAVar2 = Am_Object::Get(&Am_Screen,0x7d2,4);
  pAVar3 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(pAVar2);
LAB_001d6e5b:
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_20);
  return pAVar3;
}

Assistant:

Am_Drawonable *
Get_a_drawonable(Am_Object obj)
{
  Am_Drawonable *drawonable;
  Am_Object window, owner;

  // Please don't try to clean this up (i.e. by turning it into a single
  // complicated if statement).  Solaris gcc 2.7.0 produces buggy code
  // if you do. -- rcm
  if (obj.Valid()) {
    window = obj.Get(Am_WINDOW, Am_NO_DEPENDENCY);
    if (window.Valid()) {
      owner = obj.Get_Owner(Am_NO_DEPENDENCY);
      if (owner.Valid()) {
        drawonable =
            Am_Drawonable::Narrow(window.Get(Am_DRAWONABLE, Am_NO_DEPENDENCY));
        if (drawonable)
          return drawonable;
      }
    }
  }
  // ELSE...
  // If the object is not valid, or
  // if the object is not in a window yet,
  // or the window's drawonable has not yet been created,
  // then use the drawonable for the root screen.
  drawonable =
      Am_Drawonable::Narrow(Am_Screen.Get(Am_DRAWONABLE, Am_NO_DEPENDENCY));
  return drawonable;
}